

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILayer.cpp
# Opt level: O1

ILayer * __thiscall
ILayer::BindWithNext(ILayer *this,ILayer *nextLayer,ISynapseBuilder *synapseBuilder)

{
  size_t sVar1;
  size_t sVar2;
  INeuron *this_00;
  INeuron *this_01;
  ISynapse *synapse;
  size_t sVar3;
  size_t sVar4;
  
  sVar1 = (this->meta).size;
  if (sVar1 != 0) {
    sVar2 = (nextLayer->meta).size;
    sVar3 = 0;
    do {
      if (sVar2 != 0) {
        sVar4 = 0;
        do {
          this_00 = (this->neurons).super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[sVar3];
          this_01 = (nextLayer->neurons).super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[sVar4];
          synapse = (ISynapse *)
                    (**(code **)(*(long *)synapseBuilder + 0x10))
                              (synapseBuilder,sVar1,sVar2,this_00,this_01);
          INeuron::AddOutputSynapse(this_00,synapse);
          INeuron::AddInputSynapse(this_01,synapse);
          sVar4 = sVar4 + 1;
        } while (sVar2 != sVar4);
      }
      sVar3 = sVar3 + 1;
    } while (sVar3 != sVar1);
  }
  return this;
}

Assistant:

ILayer &ILayer::BindWithNext( ILayer &nextLayer, const ISynapseBuilder &synapseBuilder )
{
    size_t size1 = GetSize();
    size_t size2 = nextLayer.GetSize();
    for ( int prevId = 0; prevId < size1; prevId++ ) {
        for ( int nextId = 0; nextId < size2; nextId++ ) {
            INeuron *prev = neurons[prevId];
            INeuron *next = nextLayer[nextId];
            ISynapse *synapsePtr = synapseBuilder.Build( size1, size2, prev, next );
            prev->AddOutputSynapse( synapsePtr );
            next->AddInputSynapse( synapsePtr );
        }
    }
    return *this;
}